

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# greg.c
# Opt level: O1

int yy_braces(GREG *G)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int yypos19;
  int yythunkpos18;
  int yythunkpos19;
  int yypos18;
  
  iVar1 = G->pos;
  iVar2 = G->thunkpos;
  iVar3 = yymatchChar(G,0x7b);
  if (iVar3 != 0) {
    do {
      iVar3 = G->pos;
      iVar6 = G->thunkpos;
      iVar4 = yymatchChar(G,0x7d);
      iVar5 = 5;
      if (iVar4 == 0) {
        G->pos = iVar3;
        G->thunkpos = iVar6;
        iVar5 = 0;
      }
      if (iVar5 == 5) {
LAB_00103eee:
        G->pos = iVar3;
        G->thunkpos = iVar6;
        iVar5 = 0;
      }
      else if (iVar5 == 0) {
        if ((G->limit <= G->pos) && (iVar4 = yyrefill(G), iVar4 == 0)) goto LAB_00103eee;
        G->pos = G->pos + 1;
        iVar5 = 3;
      }
    } while (iVar5 != 0);
    iVar3 = yymatchChar(G,0x7d);
    iVar6 = 6;
    if (iVar3 != 0) goto LAB_00103f55;
  }
  G->pos = iVar1;
  G->thunkpos = iVar2;
  iVar3 = yymatchChar(G,0x7d);
  iVar6 = 8;
  if (iVar3 == 0) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
    if ((G->pos < G->limit) || (iVar3 = yyrefill(G), iVar3 != 0)) {
      G->pos = G->pos + 1;
      iVar6 = 0;
    }
    else {
      iVar6 = 8;
    }
  }
LAB_00103f55:
  if (iVar6 == 8) {
    G->pos = iVar1;
    G->thunkpos = iVar2;
  }
  return (uint)(iVar6 != 8);
}

Assistant:

YY_RULE(int) yy_braces(GREG *G)
{  int yypos0= G->pos, yythunkpos0= G->thunkpos;  yyprintfv((stderr, "%s\n", "braces"));

  {  int yypos14= G->pos, yythunkpos14= G->thunkpos;  if (!yymatchChar(G, '{')) goto l15;

  l16:;	
  {  int yypos17= G->pos, yythunkpos17= G->thunkpos;
  {  int yypos18= G->pos, yythunkpos18= G->thunkpos;  if (!yymatchChar(G, '}')) goto l18;
  goto l17;
  l18:;	  G->pos= yypos18; G->thunkpos= yythunkpos18;
  }  if (!yymatchDot(G)) goto l17;  goto l16;
  l17:;	  G->pos= yypos17; G->thunkpos= yythunkpos17;
  }  if (!yymatchChar(G, '}')) goto l15;
  goto l14;
  l15:;	  G->pos= yypos14; G->thunkpos= yythunkpos14;
  {  int yypos19= G->pos, yythunkpos19= G->thunkpos;  if (!yymatchChar(G, '}')) goto l19;
  goto l13;
  l19:;	  G->pos= yypos19; G->thunkpos= yythunkpos19;
  }  if (!yymatchDot(G)) goto l13;
  }
  l14:;	  yyprintf((stderr, "  ok   braces"));
  yyprintfGcontext;
  yyprintf((stderr, "\n"));

  return 1;
  l13:;	  G->pos= yypos0; G->thunkpos= yythunkpos0;  yyprintfv((stderr, "  fail %s", "braces"));
  yyprintfvGcontext;
  yyprintfv((stderr, "\n"));

  return 0;
}